

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavingz.cpp
# Opt level: O0

void __thiscall
wavingz::demod::state_machine::symbol_sm::start_of_frame_1_t::process
          (start_of_frame_1_t *this,symbol_sm_t *ctx,optional<bool> *symbol)

{
  optional<bool> *this_00;
  bool bVar1;
  reference_const_type pbVar2;
  start_of_frame_0_t *this_01;
  size_t local_48;
  unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t>_>
  local_38;
  unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
  local_30 [2];
  optional<bool> *local_20;
  optional<bool> *symbol_local;
  symbol_sm_t *ctx_local;
  start_of_frame_1_t *this_local;
  
  local_20 = symbol;
  symbol_local = (optional<bool> *)ctx;
  ctx_local = (symbol_sm_t *)this;
  bVar1 = boost::operator==(symbol);
  if (bVar1) {
    this->cnt = 0;
  }
  else {
    pbVar2 = boost::optional<bool>::operator*(local_20);
    this_00 = symbol_local;
    if ((*pbVar2 & 1U) == 0) {
      local_48 = 0;
    }
    else {
      local_48 = this->cnt + 1;
    }
    this->cnt = local_48;
    if (this->cnt == 5) {
      this_01 = (start_of_frame_0_t *)operator_new(0x10);
      memset(this_01,0,0x10);
      start_of_frame_0_t::start_of_frame_0_t(this_01);
      std::
      unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t>>
      ::
      unique_ptr<std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t>,void>
                ((unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t>>
                  *)&local_38,this_01);
      std::
      unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>>
      ::
      unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t>,void>
                ((unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>>
                  *)local_30,&local_38);
      symbol_sm_t::state((symbol_sm_t *)this_00,local_30);
      std::
      unique_ptr<wavingz::demod::state_machine::symbol_sm::state_base_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::state_base_t>_>
      ::~unique_ptr(local_30);
      std::
      unique_ptr<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t,_std::default_delete<wavingz::demod::state_machine::symbol_sm::start_of_frame_0_t>_>
      ::~unique_ptr(&local_38);
    }
  }
  return;
}

Assistant:

void
start_of_frame_1_t::process(symbol_sm_t& ctx,
                            const boost::optional<bool>& symbol)
{
    if (symbol == boost::none)
    {
        cnt = 0;
    }
    else
    {
        cnt = *symbol ? cnt + 1 : 0;
        if (cnt == 5) // we wait for 5 consecutive '1' (the last 1 of the
                      // preamble, plus the first nibble of the SOF)
        {
            ctx.state(
              std::unique_ptr<start_of_frame_0_t>(new start_of_frame_0_t()));
        }
    }
}